

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Cec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *pAVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *pGVar8;
  FILE *__stream;
  Gia_Man_t *pInit;
  char *pcVar9;
  char *pcVar10;
  Abc_Frame_t *pAbc_00;
  Cec_ParCec_t ParsCec;
  Cec_ParCec_t local_5c;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Cec_ManCecSetDefaultParams(&local_5c);
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar3 = false;
  bVar4 = false;
  do {
    while (iVar5 = Extra_UtilGetopt(argc,argv,"CTnmdasvh"), pAbc_00 = local_38,
          iVar7 = globalUtilOptind, 0x60 < iVar5) {
      switch(iVar5) {
      case 0x6d:
        bVar2 = (bool)(bVar2 ^ 1);
        break;
      case 0x6e:
        local_5c.fNaive = local_5c.fNaive ^ 1;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
        goto switchD_0022de5d_caseD_6f;
      case 0x73:
        local_5c.fSilent = local_5c.fSilent ^ 1;
        break;
      case 0x76:
        local_5c.fVerbose = local_5c.fVerbose ^ 1;
        break;
      default:
        if (iVar5 == 0x61) {
          bVar4 = (bool)(bVar4 ^ 1);
        }
        else {
          if (iVar5 != 100) goto switchD_0022de5d_caseD_6f;
          bVar3 = (bool)(bVar3 ^ 1);
        }
      }
    }
    if (iVar5 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar9 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0022df63:
        Abc_Print(-1,pcVar9);
        break;
      }
      uVar6 = atoi(argv[globalUtilOptind]);
      local_5c.nBTLimit = uVar6;
    }
    else {
      if (iVar5 != 0x54) {
        if (iVar5 == -1) {
          pGVar8 = local_38->pGia;
          if (pGVar8 == (Gia_Man_t *)0x0) {
            pcVar9 = "Abc_CommandAbc9Cec(): There is no AIG.\n";
          }
          else if (bVar2) {
            if (!bVar3) {
              if (local_5c.fSilent == 0) {
                Abc_Print(1,
                          "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n"
                          ,(ulong)(uint)local_5c.nBTLimit);
              }
              pGVar8 = Gia_ManDemiterToDual(pAbc_00->pGia);
              iVar7 = Cec_ManVerify(pGVar8,&local_5c);
              pAbc_00->Status = iVar7;
              pAVar1 = pAbc_00->pGia->pCexComb;
              pAbc_00->pGia->pCexComb = pGVar8->pCexComb;
              pGVar8->pCexComb = pAVar1;
              Gia_ManStop(pGVar8);
LAB_0022e151:
              Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexComb);
              return 0;
            }
            if ((pGVar8->vCos->nSize - pGVar8->nRegs & 1U) == 0) {
              if (local_5c.fSilent == 0) {
                Abc_Print(1,
                          "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n"
                          ,(ulong)(uint)local_5c.nBTLimit);
              }
              iVar7 = Cec_ManVerify(pAbc_00->pGia,&local_5c);
              pAbc_00->Status = iVar7;
              goto LAB_0022e151;
            }
            pcVar9 = "The dual-output miter should have an even number of outputs.\n";
          }
          else {
            if (argc - globalUtilOptind == 1) {
              pcVar9 = argv[globalUtilOptind];
              pcVar10 = pcVar9;
LAB_0022e189:
              do {
                if (*pcVar9 == '>') {
                  *pcVar9 = '\\';
                }
                else if (*pcVar9 == '\0') {
                  __stream = fopen(pcVar10,"r");
                  if (__stream == (FILE *)0x0) {
                    Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar10);
                    pcVar9 = Extra_FileGetSimilarName
                                       (pcVar10,".aig",(char *)0x0,(char *)0x0,(char *)0x0,
                                        (char *)0x0);
                    if (pcVar9 != (char *)0x0) {
                      Abc_Print(1,"Did you mean \"%s\"?",pcVar9);
                    }
                    pcVar9 = "\n";
                    iVar7 = 1;
                    iVar5 = 1;
                  }
                  else {
                    fclose(__stream);
                    iVar7 = 0;
                    pGVar8 = Gia_AigerRead(pcVar10,0,0,0);
                    if (pGVar8 != (Gia_Man_t *)0x0) {
                      pInit = Gia_ManMiter(pAbc_00->pGia,pGVar8,0,1,0,0,local_5c.fVerbose);
                      if (pInit != (Gia_Man_t *)0x0) {
                        if (bVar4) {
                          Abc_Print(0,"The verification miter is written into file \"%s\".\n",
                                    "cec_miter.aig");
                          pAbc_00 = local_38;
                          Gia_AigerWrite(pInit,"cec_miter.aig",0,0);
                        }
                        iVar7 = Cec_ManVerify(pInit,&local_5c);
                        pAbc_00->Status = iVar7;
                        Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexComb);
                        Gia_ManStop(pInit);
                      }
                      Gia_ManStop(pGVar8);
                      return 0;
                    }
                    pcVar9 = "Reading AIGER has failed.\n";
                    iVar5 = -1;
                  }
                  Abc_Print(iVar5,pcVar9);
                  return iVar7;
                }
                pcVar9 = pcVar9 + 1;
              } while( true );
            }
            pcVar9 = pGVar8->pSpec;
            pcVar10 = pcVar9;
            if (pcVar9 != (char *)0x0) goto LAB_0022e189;
            pcVar9 = "File name is not given on the command line.\n";
          }
          iVar7 = -1;
          goto LAB_0022e0a2;
        }
        break;
      }
      if (argc <= globalUtilOptind) {
        pcVar9 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0022df63;
      }
      uVar6 = atoi(argv[globalUtilOptind]);
      local_5c.TimeLimit = uVar6;
    }
    globalUtilOptind = iVar7 + 1;
  } while (-1 < (int)uVar6);
switchD_0022de5d_caseD_6f:
  Abc_Print(-2,"usage: &cec [-CT num] [-nmdasvh]\n");
  Abc_Print(-2,"\t         new combinational equivalence checker\n");
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
            (ulong)(uint)local_5c.nBTLimit);
  Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
            (ulong)(uint)local_5c.TimeLimit);
  pcVar10 = "yes";
  pcVar9 = "yes";
  if (local_5c.fNaive == 0) {
    pcVar9 = "no";
  }
  Abc_Print(-2,"\t-n     : toggle using naive SAT-based checking [default = %s]\n",pcVar9);
  pcVar9 = "miter";
  if (!bVar2) {
    pcVar9 = "two circuits";
  }
  Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar9);
  pcVar9 = "yes";
  if (!bVar3) {
    pcVar9 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar9);
  pcVar9 = "yes";
  if (!bVar4) {
    pcVar9 = "no";
  }
  Abc_Print(-2,"\t-a     : toggle writing dual-output miter [default = %s]\n",pcVar9);
  pcVar9 = "yes";
  if (local_5c.fSilent == 0) {
    pcVar9 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle silent operation [default = %s]\n",pcVar9);
  if (local_5c.fVerbose == 0) {
    pcVar10 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar10);
  pcVar9 = "\t-h     : print the command usage\n";
  iVar7 = -2;
LAB_0022e0a2:
  Abc_Print(iVar7,pcVar9);
  return 1;
}

Assistant:

int Abc_CommandAbc9Cec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    FILE * pFile;
    Gia_Man_t * pSecond, * pMiter;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int c, nArgcNew, fMiter = 0, fDualOutput = 0, fDumpMiter = 0;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTnmdasvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'n':
            pPars->fNaive ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'd':
            fDualOutput ^= 1;
            break;
        case 'a':
            fDumpMiter ^= 1;
            break;
        case 's':
            pPars->fSilent ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cec(): There is no AIG.\n" );
        return 1;
    }
    if ( fMiter )
    {
        if ( fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pAbc->Status = Cec_ManVerify( pAbc->pGia, pPars );
        }
        else
        {
            Gia_Man_t * pTemp;
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pTemp = Gia_ManDemiterToDual( pAbc->pGia );
            pAbc->Status = Cec_ManVerify( pTemp, pPars );
            ABC_SWAP( Abc_Cex_t *, pAbc->pGia->pCexComb, pTemp->pCexComb );
            Gia_ManStop( pTemp );
        }        
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        if ( pAbc->pGia->pSpec == NULL )
        {
            Abc_Print( -1, "File name is not given on the command line.\n" );
            return 1;
        }
        FileName = pAbc->pGia->pSpec;
    }
    else
        FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    // compute the miter
    pMiter = Gia_ManMiter( pAbc->pGia, pSecond, 0, 1, 0, 0, pPars->fVerbose );
    if ( pMiter )
    {
        if ( fDumpMiter )
        {
            Abc_Print( 0, "The verification miter is written into file \"%s\".\n", "cec_miter.aig" );
            Gia_AigerWrite( pMiter, "cec_miter.aig", 0, 0 );
        }
        pAbc->Status = Cec_ManVerify( pMiter, pPars );
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        Gia_ManStop( pMiter );
    }
    Gia_ManStop( pSecond );
    return 0;

usage:
    Abc_Print( -2, "usage: &cec [-CT num] [-nmdasvh]\n" );
    Abc_Print( -2, "\t         new combinational equivalence checker\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-n     : toggle using naive SAT-based checking [default = %s]\n", pPars->fNaive? "yes":"no");
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-a     : toggle writing dual-output miter [default = %s]\n", fDumpMiter? "yes":"no");
    Abc_Print( -2, "\t-s     : toggle silent operation [default = %s]\n", pPars->fSilent ? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}